

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

int If_ManSatFindCofigBits
              (void *pSat,Vec_Int_t *vPiVars,Vec_Int_t *vPoVars,word *pTruth,int nVars,word Perm,
              int nInps,Vec_Int_t *vValues)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint local_58 [16];
  
  if (0xf < nInps) {
    __assert_fail("nInps <= IF_MAX_FUNC_LUTSIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                  ,0x2be,
                  "int If_ManSatFindCofigBits(void *, Vec_Int_t *, Vec_Int_t *, word *, int, word, int, Vec_Int_t *)"
                 );
  }
  if (0 < nInps) {
    lVar2 = 0;
    do {
      uVar3 = (uint)(Perm >> ((byte)lVar2 & 0x3f)) & 0xf;
      *(uint *)((long)local_58 + lVar2) = uVar3;
      if (nVars <= (int)uVar3) {
        __assert_fail("pPerm[i] < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                      ,0x2c2,
                      "int If_ManSatFindCofigBits(void *, Vec_Int_t *, Vec_Int_t *, word *, int, word, int, Vec_Int_t *)"
                     );
      }
      lVar2 = lVar2 + 4;
    } while ((ulong)(uint)nInps << 2 != lVar2);
  }
  iVar1 = Ifn_ManSatCheckOne((sat_solver *)pSat,vPoVars,pTruth,nVars,(int *)local_58,nInps,vValues);
  vValues->nSize = 0;
  if (iVar1 != 0) {
    Ifn_ManSatDeriveOne((sat_solver *)pSat,vPiVars,vValues);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int If_ManSatFindCofigBits( void * pSat, Vec_Int_t * vPiVars, Vec_Int_t * vPoVars, word * pTruth, int nVars, word Perm, int nInps, Vec_Int_t * vValues )
{
    // extract permutation
    int RetValue, i, pPerm[IF_MAX_FUNC_LUTSIZE];
    assert( nInps <= IF_MAX_FUNC_LUTSIZE );
    for ( i = 0; i < nInps; i++ )
    {
        pPerm[i] = Abc_TtGetHex( &Perm, i );
        assert( pPerm[i] < nVars );
    }
    // perform SAT check 
    RetValue = Ifn_ManSatCheckOne( (sat_solver *)pSat, vPoVars, pTruth, nVars, pPerm, nInps, vValues );
    Vec_IntClear( vValues );
    if ( RetValue == 0 )
        return 0;
    Ifn_ManSatDeriveOne( (sat_solver*)pSat, vPiVars, vValues );
    return 1;
}